

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void __thiscall
dg::dda::MemorySSATransformation::collectAllDefinitions
          (MemorySSATransformation *this,RWNode *from,Definitions *defs,bool escaping)

{
  RWBBlock *pRVar1;
  pointer ppRVar2;
  pointer ppRVar3;
  pointer ppRVar4;
  undefined7 in_register_00000009;
  __node_base _Var5;
  iterator E;
  iterator I;
  pointer ppRVar6;
  Definitions tmpDefs;
  set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  visitedBlocks;
  Definitions local_180;
  Definitions local_f0;
  _Rb_tree<dg::dda::RWBBlock_*,_dg::dda::RWBBlock_*,_std::_Identity<dg::dda::RWBBlock_*>,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  local_60;
  
  pRVar1 = from->bblock;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._processed = false;
  local_f0.definitions._definitions._M_h._M_buckets =
       &local_f0.definitions._definitions._M_h._M_single_bucket;
  local_f0.definitions._definitions._M_h._M_bucket_count = 1;
  local_f0.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0.definitions._definitions._M_h._M_element_count = 0;
  local_f0.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
  local_f0.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_f0.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f0.kills._definitions._M_h._M_buckets = &local_f0.kills._definitions._M_h._M_single_bucket;
  local_f0.kills._definitions._M_h._M_bucket_count = 1;
  local_f0.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0.kills._definitions._M_h._M_element_count = 0;
  local_f0.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
  local_f0.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
  local_f0.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000009,escaping) == 0) {
    findDefinitionsInBlock(&local_180,from,(RWNode *)0x0);
  }
  else {
    findEscapingDefinitionsInBlock(&local_180,from);
  }
  local_f0._processed = local_180._processed;
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&local_f0.definitions,&local_180.definitions);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&local_f0.kills,&local_180.kills);
  ppRVar4 = local_f0.unknownWrites.
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  ppRVar3 = local_f0.unknownWrites.
            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_180.unknownWrites.
       super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_180.unknownWrites.
       super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_f0.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_180.unknownWrites.
       super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_180.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_180.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180.unknownWrites.super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppRVar3 != (pointer)0x0) {
    operator_delete(ppRVar3,(long)ppRVar4 - (long)ppRVar3);
    if (local_180.unknownWrites.
        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.unknownWrites.
                      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.unknownWrites.
                            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.unknownWrites.
                            super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_180.kills);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_180.definitions);
  ppRVar6 = (pRVar1->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
            super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>._predecessors
            .super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppRVar2 = *(pointer *)
             ((long)&(pRVar1->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>).
                     super_CFGElement<dg::dda::RWBBlock>.super_ElemWithEdges<dg::dda::RWBBlock>.
                     _predecessors.
                     super__Vector_base<dg::dda::RWBBlock_*,_std::allocator<dg::dda::RWBBlock_*>_>.
                     _M_impl.super__Vector_impl_data + 8);
  if (((long)ppRVar2 - (long)ppRVar6 == 8) && (ppRVar2[-1] != (RWBBlock *)0x0)) {
    collectAllDefinitions
              (this,defs,ppRVar2[-1],
               (set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
                *)&local_60,escaping);
  }
  else if (ppRVar6 != ppRVar2) {
    do {
      local_180._processed = false;
      local_180.definitions._definitions._M_h._M_buckets =
           &local_180.definitions._definitions._M_h._M_single_bucket;
      local_180.definitions._definitions._M_h._M_bucket_count = 1;
      local_180.definitions._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_180.definitions._definitions._M_h._M_element_count = 0;
      local_180.definitions._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_180.definitions._definitions._M_h._M_rehash_policy._4_4_ = 0;
      local_180.definitions._definitions._M_h._M_rehash_policy._M_next_resize = 0;
      local_180.definitions._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      local_180.kills._definitions._M_h._M_buckets =
           &local_180.kills._definitions._M_h._M_single_bucket;
      local_180.kills._definitions._M_h._M_bucket_count = 1;
      local_180.kills._definitions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_180.kills._definitions._M_h._M_element_count = 0;
      local_180.kills._definitions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      local_180.kills._definitions._M_h._M_rehash_policy._4_4_ = 0;
      local_180.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_180.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_180.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_180.kills._definitions._M_h._M_rehash_policy._M_next_resize = 0;
      local_180.kills._definitions._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<dg::dda::RWNode*,std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>,std::allocator<std::pair<dg::dda::RWNode*const,dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>>>,std::__detail::_Select1st,std::equal_to<dg::dda::RWNode*>,std::hash<dg::dda::RWNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_180.definitions,
                 (_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&local_f0.kills);
      collectAllDefinitions
                (this,&local_180,*ppRVar6,
                 (set<dg::dda::RWBBlock_*,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
                  *)&local_60,escaping);
      for (_Var5._M_nxt = local_180.definitions._definitions._M_h._M_before_begin._M_nxt;
          _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
        DefinitionsMap<dg::dda::RWNode>::add
                  (&defs->definitions,(RWNode *)_Var5._M_nxt[1]._M_nxt,
                   (OffsetsT *)(_Var5._M_nxt + 2));
      }
      std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
                ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&defs->unknownWrites,
                 (defs->unknownWrites).
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 local_180.unknownWrites.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_180.unknownWrites.
                 super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (local_180.unknownWrites.
          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.unknownWrites.
                        super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_180.unknownWrites.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_180.unknownWrites.
                              super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_180.kills);
      std::
      _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_180.definitions);
      ppRVar6 = ppRVar6 + 1;
    } while (ppRVar6 != ppRVar2);
  }
  collectAllDefinitionsInCallers(this,defs,pRVar1->subgraph);
  joinDefinitions(defs,&local_f0,false);
  Definitions::swap(defs,&local_f0);
  if (local_f0.unknownWrites.
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.unknownWrites.
                    super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.unknownWrites.
                          super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_f0.kills);
  std::
  _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_f0.definitions);
  std::
  _Rb_tree<dg::dda::RWBBlock_*,_dg::dda::RWBBlock_*,_std::_Identity<dg::dda::RWBBlock_*>,_std::less<dg::dda::RWBBlock_*>,_std::allocator<dg::dda::RWBBlock_*>_>
  ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void MemorySSATransformation::collectAllDefinitions(RWNode *from,
                                                    Definitions &defs,
                                                    bool escaping) {
    assert(from->getBBlock() && "The node has no BBlock");

    auto *block = from->getBBlock();
    std::set<RWBBlock *> visitedBlocks; // for terminating the search

    Definitions D;
    if (escaping) {
        D = findEscapingDefinitionsInBlock(from);
    } else {
        D = findDefinitionsInBlock(from);
    }

    ///
    // -- Get the definitions from predecessors in this subgraph --
    //
    // NOTE: do not add block to visitedBlocks, it may be its own predecessor,
    // in which case we want to process it again
    if (auto *singlePred = block->getSinglePredecessor()) {
        collectAllDefinitions(defs, singlePred, visitedBlocks, escaping);
    } else {
        // multiple predecessors
        for (auto I = block->pred_begin(), E = block->pred_end(); I != E; ++I) {
            // assign 'kills' to not to search for what we already have
            Definitions tmpDefs;
            tmpDefs.definitions = D.kills;
            collectAllDefinitions(tmpDefs, *I, visitedBlocks, escaping);
            defs.definitions.add(tmpDefs.definitions);
            defs.unknownWrites.insert(defs.unknownWrites.end(),
                                      tmpDefs.unknownWrites.begin(),
                                      tmpDefs.unknownWrites.end());
        }
    }

    ///
    // -- Get the definitions from predecessors
    //    in the callers of this subgraph --
    //
    collectAllDefinitionsInCallers(defs, block->getSubgraph());

    // create the final map of definitions reaching the 'from' node
    joinDefinitions(defs, D);
    defs.swap(D);
}